

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O3

void __thiscall bloom_filter::generate_unique_salt(bloom_filter *this)

{
  pointer puVar1;
  unsigned_long_long uVar2;
  int iVar3;
  int iVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  iterator __position;
  bool bVar9;
  uint local_2c [2];
  bloom_type current_salt;
  
  if ((ulong)this->salt_count_ < 0x81) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (generate_unique_salt::predef_salt,
               generate_unique_salt::predef_salt + this->salt_count_,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->salt_);
    puVar1 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar7 != 0) {
      uVar8 = lVar7 >> 2;
      uVar2 = this->random_seed_;
      uVar6 = 3;
      do {
        puVar1[uVar6 - 3] = puVar1[uVar6 % uVar8] * puVar1[uVar6 - 3] + (int)uVar2;
        lVar7 = (-(ulong)(uVar8 == 0) - uVar8) + uVar6;
        uVar6 = uVar6 + 1;
      } while (lVar7 != 2);
    }
  }
  else {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (generate_unique_salt::predef_salt,(uint *)&DAT_0011c010,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               &this->salt_);
    srand((uint)this->random_seed_);
    if ((ulong)((long)(this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) < (ulong)this->salt_count_) {
      do {
        iVar3 = rand();
        iVar4 = rand();
        local_2c[0] = iVar4 * iVar3;
        __position._M_current =
             (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (local_2c[0] != 0) {
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                            ((this->salt_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,__position._M_current,local_2c);
          bVar9 = __position._M_current == _Var5._M_current;
          __position._M_current =
               (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (bVar9) {
            if (__position._M_current ==
                (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->salt_,
                         __position,local_2c);
              __position._M_current =
                   (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *__position._M_current = local_2c[0];
              __position._M_current = __position._M_current + 1;
              (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current;
            }
          }
        }
      } while ((ulong)((long)__position._M_current -
                       (long)(this->salt_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2) < (ulong)this->salt_count_);
    }
  }
  return;
}

Assistant:

void generate_unique_salt()
   {
      /*
        Note:
        A distinct hash function need not be implementation-wise
        distinct. In the current implementation "seeding" a common
        hash function with different values seems to be adequate.
      */
      const unsigned int predef_salt_count = 128;

      static const bloom_type predef_salt[predef_salt_count] =
                                 {
                                    0xAAAAAAAA, 0x55555555, 0x33333333, 0xCCCCCCCC,
                                    0x66666666, 0x99999999, 0xB5B5B5B5, 0x4B4B4B4B,
                                    0xAA55AA55, 0x55335533, 0x33CC33CC, 0xCC66CC66,
                                    0x66996699, 0x99B599B5, 0xB54BB54B, 0x4BAA4BAA,
                                    0xAA33AA33, 0x55CC55CC, 0x33663366, 0xCC99CC99,
                                    0x66B566B5, 0x994B994B, 0xB5AAB5AA, 0xAAAAAA33,
                                    0x555555CC, 0x33333366, 0xCCCCCC99, 0x666666B5,
                                    0x9999994B, 0xB5B5B5AA, 0xFFFFFFFF, 0xFFFF0000,
                                    0xB823D5EB, 0xC1191CDF, 0xF623AEB3, 0xDB58499F,
                                    0xC8D42E70, 0xB173F616, 0xA91A5967, 0xDA427D63,
                                    0xB1E8A2EA, 0xF6C0D155, 0x4909FEA3, 0xA68CC6A7,
                                    0xC395E782, 0xA26057EB, 0x0CD5DA28, 0x467C5492,
                                    0xF15E6982, 0x61C6FAD3, 0x9615E352, 0x6E9E355A,
                                    0x689B563E, 0x0C9831A8, 0x6753C18B, 0xA622689B,
                                    0x8CA63C47, 0x42CC2884, 0x8E89919B, 0x6EDBD7D3,
                                    0x15B6796C, 0x1D6FDFE4, 0x63FF9092, 0xE7401432,
                                    0xEFFE9412, 0xAEAEDF79, 0x9F245A31, 0x83C136FC,
                                    0xC3DA4A8C, 0xA5112C8C, 0x5271F491, 0x9A948DAB,
                                    0xCEE59A8D, 0xB5F525AB, 0x59D13217, 0x24E7C331,
                                    0x697C2103, 0x84B0A460, 0x86156DA9, 0xAEF2AC68,
                                    0x23243DA5, 0x3F649643, 0x5FA495A8, 0x67710DF8,
                                    0x9A6C499E, 0xDCFB0227, 0x46A43433, 0x1832B07A,
                                    0xC46AFF3C, 0xB9C8FFF0, 0xC9500467, 0x34431BDF,
                                    0xB652432B, 0xE367F12B, 0x427F4C1B, 0x224C006E,
                                    0x2E7E5A89, 0x96F99AA5, 0x0BEB452A, 0x2FD87C39,
                                    0x74B2E1FB, 0x222EFD24, 0xF357F60C, 0x440FCB1E,
                                    0x8BBE030F, 0x6704DC29, 0x1144D12F, 0x948B1355,
                                    0x6D8FD7E9, 0x1C11A014, 0xADD1592F, 0xFB3C712E,
                                    0xFC77642F, 0xF9C4CE8C, 0x31312FB9, 0x08B0DD79,
                                    0x318FA6E7, 0xC040D23D, 0xC0589AA7, 0x0CA5C075,
                                    0xF874B172, 0x0CF914D5, 0x784D3280, 0x4E8CFEBC,
                                    0xC569F575, 0xCDB2A091, 0x2CC016B4, 0x5C5F4421
                                 };

      if (salt_count_ <= predef_salt_count)
      {
         std::copy(predef_salt,
                   predef_salt + salt_count_,
                   std::back_inserter(salt_));

         for (std::size_t i = 0; i < salt_.size(); ++i)
         {
            /*
               Note:
               This is done to integrate the user defined random seed,
               so as to allow for the generation of unique bloom filter
               instances.
            */
            salt_[i] = salt_[i] * salt_[(i + 3) % salt_.size()] + static_cast<bloom_type>(random_seed_);
         }
      }
      else
      {
         std::copy(predef_salt, predef_salt + predef_salt_count, std::back_inserter(salt_));

         srand(static_cast<unsigned int>(random_seed_));

         while (salt_.size() < salt_count_)
         {
            bloom_type current_salt = static_cast<bloom_type>(rand()) * static_cast<bloom_type>(rand());

            if (0 == current_salt)
               continue;

            if (salt_.end() == std::find(salt_.begin(), salt_.end(), current_salt))
            {
               salt_.push_back(current_salt);
            }
         }
      }
   }